

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool google::protobuf::internal::MergeFromImpl<true>
               (ZeroCopyInputStream *input,MessageLite *msg,ParseFlags parse_flags)

{
  int iVar1;
  undefined4 extraout_var;
  bool local_a9;
  undefined1 local_a8 [8];
  ParseContext ctx;
  char *ptr;
  ParseFlags parse_flags_local;
  MessageLite *msg_local;
  ZeroCopyInputStream *input_local;
  
  msg_local = (MessageLite *)input;
  iVar1 = io::CodedInputStream::GetDefaultRecursionLimit();
  ParseContext::ParseContext<google::protobuf::io::ZeroCopyInputStream*&>
            ((ParseContext *)local_a8,iVar1,true,(char **)&ctx.data_.arena,
             (ZeroCopyInputStream **)&msg_local);
  iVar1 = (*msg->_vptr_MessageLite[10])(msg,ctx.data_.arena,local_a8);
  ctx.data_.arena = (Arena *)CONCAT44(extraout_var,iVar1);
  local_a9 = false;
  if (ctx.data_.arena != (Arena *)0x0) {
    local_a9 = EpsCopyInputStream::EndedAtEndOfStream((EpsCopyInputStream *)local_a8);
  }
  if (local_a9 == false) {
    input_local._7_1_ = false;
  }
  else {
    input_local._7_1_ =
         anon_unknown_13::CheckFieldPresence((ParseContext *)local_a8,msg,parse_flags);
  }
  return input_local._7_1_;
}

Assistant:

bool MergeFromImpl(io::ZeroCopyInputStream* input, MessageLite* msg,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input);
  ptr = msg->_InternalParse(ptr, &ctx);
  // ctx has no explicit limit (hence we end on end of stream)
  if (PROTOBUF_PREDICT_TRUE(ptr && ctx.EndedAtEndOfStream())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}